

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboApiTests.cpp
# Opt level: O2

void deqp::gles3::Functional::checkFboAttachmentParam
               (TestContext *testCtx,Context *ctx,GLenum attachment,GLenum pname,GLint expectedValue
               )

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  int iVar3;
  InternalError *this;
  char *pcVar4;
  allocator<char> local_225;
  GLint value;
  string local_220 [32];
  TestContext *local_200;
  char tmp [64];
  undefined1 local_1b0 [384];
  
  pTVar2 = testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_200 = testCtx;
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"// Querying ");
  if (attachment == 0x8ce0) {
    pcVar4 = "GL_COLOR_ATTACHMENT0";
  }
  else if (attachment == 0x8d20) {
    pcVar4 = "GL_STENCIL_ATTACHMENT";
  }
  else {
    if (attachment != 0x8d00) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this,"Unknown attachment",glcts::fixed_sample_locations_values + 1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboApiTests.cpp"
                 ,0x56);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
    }
    pcVar4 = "GL_DEPTH_ATTACHMENT";
  }
  std::operator<<((ostream *)poVar1,pcVar4);
  std::operator<<((ostream *)poVar1," ");
  std::operator<<((ostream *)poVar1,
                  &DAT_0186db64 +
                  *(int *)("Capturing whole array in TF" + (long)(int)pname * 4 + 0xc));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  value = -0x32323233;
  (*ctx->_vptr_Context[0x22])(ctx,0x8d40,(ulong)attachment,(ulong)pname);
  iVar3 = (*ctx->_vptr_Context[0x79])(ctx);
  if ((iVar3 == 0) && (value == expectedValue)) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Pass");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  else {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"// Fail, expected ");
    switch(expectedValue) {
    case 0x8515:
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"GL_TEXTURE_CUBE_MAP_POSITIVE_X",(allocator<char> *)tmp);
      break;
    case 0x8516:
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"GL_TEXTURE_CUBE_MAP_NEGATIVE_X",(allocator<char> *)tmp);
      break;
    case 0x8517:
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"GL_TEXTURE_CUBE_MAP_POSITIVE_Y",(allocator<char> *)tmp);
      break;
    case 0x8518:
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Y",(allocator<char> *)tmp);
      break;
    case 0x8519:
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"GL_TEXTURE_CUBE_MAP_POSITIVE_Z",(allocator<char> *)tmp);
      break;
    case 0x851a:
      std::__cxx11::string::string<std::allocator<char>>
                (local_220,"GL_TEXTURE_CUBE_MAP_NEGATIVE_Z",(allocator<char> *)tmp);
      break;
    default:
      if (expectedValue == 0x8d41) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_220,"GL_RENDERBUFFER",(allocator<char> *)tmp);
      }
      else if (expectedValue == 0x1702) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_220,"GL_TEXTURE",(allocator<char> *)tmp);
      }
      else if (expectedValue == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  (local_220,"GL_NONE(0)",(allocator<char> *)tmp);
      }
      else {
        deSprintf(tmp,0x40,"0x%x",(ulong)(uint)expectedValue);
        std::__cxx11::string::string<std::allocator<char>>(local_220,tmp,&local_225);
      }
    }
    std::operator<<((ostream *)poVar1,local_220);
    std::operator<<((ostream *)poVar1," without error");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string(local_220);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    tcu::TestContext::setTestResult
              (local_200,QP_TEST_RESULT_FAIL,"Invalid result for attachment param query");
  }
  return;
}

Assistant:

static void checkFboAttachmentParam (tcu::TestContext& testCtx, sglr::Context& ctx, GLenum attachment, GLenum pname, GLint expectedValue)
{
	TestLog& log = testCtx.getLog();
	log << TestLog::Message << "// Querying " << getAttachmentName(attachment) << " " << getAttachmentParameterName(pname) << TestLog::EndMessage;

	GLint value = 0xcdcdcdcd;
	ctx.getFramebufferAttachmentParameteriv(GL_FRAMEBUFFER, attachment, pname, &value);

	GLenum err = ctx.getError();

	if (value == expectedValue && err == GL_NO_ERROR)
		log << TestLog::Message << "// Pass" << TestLog::EndMessage;
	else
	{
		log << TestLog::Message << "// Fail, expected " << getAttachmentParameterValueName(expectedValue) << " without error" << TestLog::EndMessage;
		testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid result for attachment param query");
	}
}